

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::bt_peer_connection::on_reject_request(bt_peer_connection *this,int received)

{
  bool bVar1;
  int iVar2;
  int32_t val;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_5c;
  char *local_58;
  char *ptr;
  int32_t local_48;
  peer_request r;
  span<const_char> recv_buffer;
  error_code local_28;
  int local_14;
  bt_peer_connection *pbStack_10;
  int received_local;
  bt_peer_connection *this_local;
  
  local_14 = received;
  pbStack_10 = this;
  peer_connection::received_bytes(&this->super_peer_connection,0,received);
  if ((((byte)(this->super_peer_connection).field_0x889 >> 2 & 1) == 0) ||
     (iVar2 = crypto_receive_buffer::packet_size(&this->m_recv_buffer), iVar2 != 0xd)) {
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              (&local_28,invalid_reject,(type *)0x0);
    (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
              (this,&local_28,1,2);
  }
  else {
    bVar1 = crypto_receive_buffer::packet_finished(&this->m_recv_buffer);
    if (bVar1) {
      join_0x00000010_0x00000000_ = crypto_receive_buffer::get(&this->m_recv_buffer);
      local_58 = span<const_char>::data((span<const_char> *)&r.start);
      local_58 = local_58 + 1;
      val = read_int32<char_const*>(&local_58);
      strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef(&local_5c,val);
      ptr._4_4_ = local_5c.m_val;
      local_48 = read_int32<char_const*>(&local_58);
      r.piece.m_val = read_int32<char_const*>(&local_58);
      peer_connection::incoming_reject_request
                (&this->super_peer_connection,(peer_request *)((long)&ptr + 4));
    }
  }
  return;
}

Assistant:

void bt_peer_connection::on_reject_request(int received)
	{
		INVARIANT_CHECK;

		received_bytes(0, received);
		if (!m_supports_fast || m_recv_buffer.packet_size() != 13)
		{
			disconnect(errors::invalid_reject, operation_t::bittorrent, peer_error);
			return;
		}

		if (!m_recv_buffer.packet_finished()) return;

		span<char const> recv_buffer = m_recv_buffer.get();

		peer_request r;
		const char* ptr = recv_buffer.data() + 1;
		r.piece = piece_index_t(aux::read_int32(ptr));
		r.start = aux::read_int32(ptr);
		r.length = aux::read_int32(ptr);

		incoming_reject_request(r);
	}